

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

uint32 __thiscall Clasp::Solver::undoUntilImpl(Solver *this,uint32 level,bool forceSave)

{
  uint32 *puVar1;
  uint32 uVar2;
  pointer pDVar3;
  uint uVar4;
  uint uVar5;
  bool sp;
  long *plVar6;
  uint uVar7;
  bool bVar8;
  
  uVar7 = *(uint *)&(this->levels_).field_0x14 & 0x3fffffff;
  if (uVar7 <= level) {
    uVar7 = level;
  }
  uVar4 = (this->levels_).super_type.ebo_.size;
  uVar5 = uVar4 - uVar7;
  if (uVar7 <= uVar4 && uVar5 != 0) {
    (this->levels_).jump = uVar5;
    sp = true;
    if (!forceSave) {
      if (*(uint *)&this->strategy_ < 0x10000) {
        sp = false;
      }
      else {
        sp = *(uint *)&this->strategy_ >> 0x10 <= uVar5;
      }
    }
    pDVar3 = (this->levels_).super_type.ebo_.buf;
    if ((this->conflict_).ebo_.size == 0) {
      bVar8 = -1 < *(int *)(pDVar3 + (uVar4 - 1));
    }
    else {
      bVar8 = false;
    }
    (this->conflict_).ebo_.size = 0;
    plVar6 = (long *)((this->heuristic_).ptr_ & 0xfffffffffffffffe);
    (**(code **)(*plVar6 + 0x40))(plVar6,this,*(uint *)(pDVar3 + uVar7) & 0x3fffffff);
    undoLevel(this,(bool)(bVar8 & sp));
    puVar1 = &(this->levels_).jump;
    *puVar1 = *puVar1 - 1;
    uVar2 = *puVar1;
    while (uVar4 = uVar7, uVar2 != 0) {
      undoLevel(this,sp);
      puVar1 = &(this->levels_).jump;
      *puVar1 = *puVar1 - 1;
      uVar2 = *puVar1;
    }
  }
  return uVar4;
}

Assistant:

uint32 Solver::undoUntilImpl(uint32 level, bool forceSave) {
	level      = std::max( level, backtrackLevel() );
	if (level >= decisionLevel()) { return decisionLevel(); }
	uint32& n  = (levels_.jump = decisionLevel() - level);
	bool sp    = forceSave || (strategy_.saveProgress > 0 && ((uint32)strategy_.saveProgress) <= n);
	bool ok    = conflict_.empty() && levels_.back().freeze == 0;
	conflict_.clear();
	heuristic_->undoUntil( *this, levels_[level].trailPos);
	undoLevel(sp && ok);
	while (--n) { undoLevel(sp); }
	return level;
}